

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteHeader(BinaryWriter *this,char *name,int index)

{
  if (this == (BinaryWriter *)0x0) {
    return;
  }
  if (index != -1) {
    Stream::Writef((Stream *)this,"; %s %d\n",name);
    return;
  }
  Stream::Writef((Stream *)this,"; %s\n",name);
  return;
}

Assistant:

void BinaryWriter::WriteHeader(const char* name, int index) {
  if (stream_->has_log_stream()) {
    if (index == PRINT_HEADER_NO_INDEX) {
      stream_->log_stream().Writef("; %s\n", name);
    } else {
      stream_->log_stream().Writef("; %s %d\n", name, index);
    }
  }
}